

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_timer.cpp
# Opt level: O3

int I_GetTimePolled(bool saveMS)

{
  undefined1 auVar1 [16];
  DWORD DVar2;
  
  if (TicFrozen != 0) {
    return TicFrozen;
  }
  DVar2 = SDL_GetTicks();
  if (saveMS) {
    TicStart = DVar2;
  }
  auVar1 = SEXT816((long)(int)(DVar2 - BaseTime) * 0x23) * SEXT816(0x20c49ba5e353f7cf);
  return (int)(auVar1._8_8_ >> 7) - (auVar1._12_4_ >> 0x1f);
}

Assistant:

int I_GetTimePolled (bool saveMS)
{
	if (TicFrozen != 0)
	{
		return TicFrozen;
	}

	DWORD tm = SDL_GetTicks();

	if (saveMS)
	{
		TicStart = tm;
	}
	return Scale(tm - BaseTime, TICRATE, 1000);
}